

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall btSoftBody::LJoint::Solve(LJoint *this,btScalar dt,btScalar sor)

{
  Body *this_00;
  Body *this_01;
  ulong uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  btVector3 bVar7;
  btVector3 bVar8;
  Impulse i;
  float local_b8;
  float fStack_b4;
  float local_a8;
  Impulse local_88;
  Impulse local_58;
  
  this_00 = (this->super_Joint).m_bodies;
  bVar7 = Body::velocity(this_00,this->m_rpos);
  this_01 = (this->super_Joint).m_bodies + 1;
  bVar8 = Body::velocity(this_01,this->m_rpos + 1);
  local_b8 = bVar7.m_floats[0];
  fStack_b4 = bVar7.m_floats[1];
  local_a8 = bVar7.m_floats[2];
  local_58.m_drift.m_floats[0] = 0.0;
  local_58.m_drift.m_floats[1] = 0.0;
  local_58.m_drift.m_floats[2] = 0.0;
  local_58.m_drift.m_floats[3] = 0.0;
  local_58._32_1_ = 1;
  fVar2 = (this->super_Joint).m_cfm;
  fVar5 = (local_b8 - bVar8.m_floats[0]) * fVar2 + (this->super_Joint).m_drift.m_floats[0];
  fVar3 = (fStack_b4 - bVar8.m_floats[1]) * fVar2 + (this->super_Joint).m_drift.m_floats[1];
  fVar6 = (local_a8 - bVar8.m_floats[2]) * fVar2 + (this->super_Joint).m_drift.m_floats[2];
  fVar2 = ((this->super_Joint).m_massmatrix.m_el[2].m_floats[2] * fVar6 +
          (this->super_Joint).m_massmatrix.m_el[2].m_floats[0] * fVar5 +
          (this->super_Joint).m_massmatrix.m_el[2].m_floats[1] * fVar3) * sor;
  fVar4 = sor * (fVar6 * (this->super_Joint).m_massmatrix.m_el[0].m_floats[2] +
                fVar5 * (this->super_Joint).m_massmatrix.m_el[0].m_floats[0] +
                (this->super_Joint).m_massmatrix.m_el[0].m_floats[1] * fVar3);
  fVar3 = sor * (fVar6 * (this->super_Joint).m_massmatrix.m_el[1].m_floats[2] +
                fVar5 * (this->super_Joint).m_massmatrix.m_el[1].m_floats[0] +
                (this->super_Joint).m_massmatrix.m_el[1].m_floats[1] * fVar3);
  local_58.m_velocity.m_floats[2] = fVar2;
  local_58.m_velocity.m_floats[0] = fVar4;
  local_58.m_velocity.m_floats[1] = fVar3;
  local_58.m_velocity.m_floats[3] = 0.0;
  local_88._32_4_ = local_58._32_4_;
  uVar1 = CONCAT44(fVar3,fVar4) ^ 0x8000000080000000;
  local_88.m_velocity.m_floats[2] = -fVar2;
  local_88.m_velocity.m_floats[0] = (btScalar)(int)uVar1;
  local_88.m_velocity.m_floats[1] = (btScalar)(int)(uVar1 >> 0x20);
  local_88.m_velocity.m_floats[3] = 0.0;
  local_88.m_drift.m_floats[2] = -0.0;
  local_88.m_drift.m_floats[0] = -0.0;
  local_88.m_drift.m_floats[1] = -0.0;
  local_88.m_drift.m_floats[3] = 0.0;
  Body::applyImpulse(this_00,&local_88,this->m_rpos);
  Body::applyImpulse(this_01,&local_58,this->m_rpos + 1);
  return;
}

Assistant:

void				btSoftBody::LJoint::Solve(btScalar dt,btScalar sor)
{
	const btVector3		va=m_bodies[0].velocity(m_rpos[0]);
	const btVector3		vb=m_bodies[1].velocity(m_rpos[1]);
	const btVector3		vr=va-vb;
	btSoftBody::Impulse	impulse;
	impulse.m_asVelocity	=	1;
	impulse.m_velocity		=	m_massmatrix*(m_drift+vr*m_cfm)*sor;
	m_bodies[0].applyImpulse(-impulse,m_rpos[0]);
	m_bodies[1].applyImpulse( impulse,m_rpos[1]);
}